

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::XmlReporter::testCaseStarting(XmlReporter *this,TestCaseInfo *testInfo)

{
  char *this_00;
  int iVar1;
  XmlWriter *this_01;
  timeval t;
  string local_88;
  string local_68;
  string local_48;
  
  Option<Catch::TestCaseInfo>::reset
            (&(this->super_StreamingReporterBase).currentTestCaseInfo.
              super_Option<Catch::TestCaseInfo>);
  this_00 = (this->super_StreamingReporterBase).currentTestCaseInfo.
            super_Option<Catch::TestCaseInfo>.storage;
  TestCaseInfo::TestCaseInfo((TestCaseInfo *)this_00,testInfo);
  (this->super_StreamingReporterBase).currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.
  nullableValue = (TestCaseInfo *)this_00;
  (this->super_StreamingReporterBase).currentTestCaseInfo.used = false;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"TestCase","");
  this_01 = XmlWriter::startElement(&this->m_xml,&local_68);
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"name","");
  trim(&local_48,&testInfo->name);
  XmlWriter::writeAttribute(this_01,&local_88,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  iVar1 = (*(((this->super_StreamingReporterBase).m_config.m_p)->super_IShared).super_NonCopyable.
            _vptr_NonCopyable[0xc])();
  if (iVar1 == 1) {
    gettimeofday((timeval *)&local_68,(__timezone_ptr_t)0x0);
    (this->m_testCaseTimer).m_ticks =
         (long)local_68._M_dataplus._M_p * 1000000 + local_68._M_string_length;
  }
  return;
}

Assistant:

virtual void testCaseStarting( TestCaseInfo const& testInfo ) CATCH_OVERRIDE {
            StreamingReporterBase::testCaseStarting(testInfo);
            m_xml.startElement( "TestCase" ).writeAttribute( "name", trim( testInfo.name ) );

            if ( m_config->showDurations() == ShowDurations::Always )
                m_testCaseTimer.start();
        }